

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern-computer.cpp
# Opt level: O0

WiningPatterns * __thiscall
mahjong::PatternComputer::recognize(WiningPatterns *__return_storage_ptr__,PatternComputer *this)

{
  bool bVar1;
  pointer pPVar2;
  iterator __first;
  iterator __last;
  undefined1 local_70 [8];
  set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_> p;
  unique_ptr<mahjong::PatternRecognizer,_std::default_delete<mahjong::PatternRecognizer>_> *it;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<mahjong::PatternRecognizer,_std::default_delete<mahjong::PatternRecognizer>_>,_std::allocator<std::unique_ptr<mahjong::PatternRecognizer,_std::default_delete<mahjong::PatternRecognizer>_>_>_>
  *__range1;
  PatternComputer *this_local;
  set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_> *patterns;
  
  std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::set
            (__return_storage_ptr__);
  __end1 = std::
           vector<std::unique_ptr<mahjong::PatternRecognizer,_std::default_delete<mahjong::PatternRecognizer>_>,_std::allocator<std::unique_ptr<mahjong::PatternRecognizer,_std::default_delete<mahjong::PatternRecognizer>_>_>_>
           ::begin(&this->recognizers);
  it = (unique_ptr<mahjong::PatternRecognizer,_std::default_delete<mahjong::PatternRecognizer>_> *)
       std::
       vector<std::unique_ptr<mahjong::PatternRecognizer,_std::default_delete<mahjong::PatternRecognizer>_>,_std::allocator<std::unique_ptr<mahjong::PatternRecognizer,_std::default_delete<mahjong::PatternRecognizer>_>_>_>
       ::end(&this->recognizers);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::unique_ptr<mahjong::PatternRecognizer,_std::default_delete<mahjong::PatternRecognizer>_>_*,_std::vector<std::unique_ptr<mahjong::PatternRecognizer,_std::default_delete<mahjong::PatternRecognizer>_>,_std::allocator<std::unique_ptr<mahjong::PatternRecognizer,_std::default_delete<mahjong::PatternRecognizer>_>_>_>_>
                                     *)&it), bVar1) {
    p._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)__gnu_cxx::
                 __normal_iterator<std::unique_ptr<mahjong::PatternRecognizer,_std::default_delete<mahjong::PatternRecognizer>_>_*,_std::vector<std::unique_ptr<mahjong::PatternRecognizer,_std::default_delete<mahjong::PatternRecognizer>_>,_std::allocator<std::unique_ptr<mahjong::PatternRecognizer,_std::default_delete<mahjong::PatternRecognizer>_>_>_>_>
                 ::operator*(&__end1);
    pPVar2 = std::
             unique_ptr<mahjong::PatternRecognizer,_std::default_delete<mahjong::PatternRecognizer>_>
             ::operator->((unique_ptr<mahjong::PatternRecognizer,_std::default_delete<mahjong::PatternRecognizer>_>
                           *)p._M_t._M_impl.super__Rb_tree_header._M_node_count);
    (*pPVar2->_vptr_PatternRecognizer[5])(local_70);
    __first = std::
              set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
              ::begin((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
                       *)local_70);
    __last = std::
             set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
             end((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
                  *)local_70);
    std::set<mahjong::Pattern,std::less<mahjong::Pattern>,std::allocator<mahjong::Pattern>>::
    insert<std::_Rb_tree_const_iterator<mahjong::Pattern>>
              ((set<mahjong::Pattern,std::less<mahjong::Pattern>,std::allocator<mahjong::Pattern>> *
               )__return_storage_ptr__,(_Rb_tree_const_iterator<mahjong::Pattern>)__first._M_node,
               (_Rb_tree_const_iterator<mahjong::Pattern>)__last._M_node);
    std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::~set
              ((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
                *)local_70);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<mahjong::PatternRecognizer,_std::default_delete<mahjong::PatternRecognizer>_>_*,_std::vector<std::unique_ptr<mahjong::PatternRecognizer,_std::default_delete<mahjong::PatternRecognizer>_>,_std::allocator<std::unique_ptr<mahjong::PatternRecognizer,_std::default_delete<mahjong::PatternRecognizer>_>_>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

PatternComputer::WiningPatterns PatternComputer::recognize()
{
	set<Pattern> patterns;

	for (auto& it : recognizers)
	{
		auto p = it->recognize();
		patterns.insert(p.begin(), p.end());
	}

	return patterns;
}